

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O0

SigmoidKernel * __thiscall CoreML::Specification::Kernel::mutable_sigmoidkernel(Kernel *this)

{
  bool bVar1;
  SigmoidKernel *this_00;
  Kernel *this_local;
  
  bVar1 = has_sigmoidkernel(this);
  if (!bVar1) {
    clear_kernel(this);
    set_has_sigmoidkernel(this);
    this_00 = (SigmoidKernel *)operator_new(0x28);
    SigmoidKernel::SigmoidKernel(this_00);
    (this->kernel_).sigmoidkernel_ = this_00;
  }
  return (SigmoidKernel *)(this->kernel_).linearkernel_;
}

Assistant:

inline ::CoreML::Specification::SigmoidKernel* Kernel::mutable_sigmoidkernel() {
  if (!has_sigmoidkernel()) {
    clear_kernel();
    set_has_sigmoidkernel();
    kernel_.sigmoidkernel_ = new ::CoreML::Specification::SigmoidKernel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Kernel.sigmoidKernel)
  return kernel_.sigmoidkernel_;
}